

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::ValidateTestPropertyName
               (string *property_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reserved_names)

{
  ostream *poVar1;
  int *piVar2;
  AssertHelperData *pAVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  pointer pbVar5;
  pointer pbVar6;
  ulong uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  AssertHelper local_88;
  AssertHelperData *local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  ostream *local_60;
  Message local_58;
  string local_50;
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,property_name);
  pbVar9 = (reserved_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != pbVar9) {
    Message::Message(&local_58);
    local_78 = local_58.ss_.ptr_;
    poVar1 = (ostream *)((long)local_58.ss_.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(property_name->_M_dataplus)._M_p,property_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    local_70 = pbVar9;
    local_68 = _Var4._M_current;
    local_60 = poVar1;
    Message::Message((Message *)&local_88);
    pbVar6 = (reserved_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (reserved_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_80 = local_88.data_;
    if ((long)pbVar5 - (long)pbVar6 != 0) {
      uVar7 = (long)pbVar5 - (long)pbVar6 >> 5;
      piVar2 = &(local_88.data_)->line;
      lVar10 = 8;
      uVar8 = 0;
      do {
        if (2 < uVar7 && uVar8 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar2,", ",2);
          pbVar6 = (reserved_names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = (reserved_names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        if (uVar8 == ((long)pbVar5 - (long)pbVar6 >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar2,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar2,"\'",1);
        pbVar6 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)piVar2,*(char **)((long)pbVar6 + lVar10 + -8),
                   *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar2,"\'",1);
        uVar8 = uVar8 + 1;
        pbVar6 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar7 = (long)pbVar5 - (long)pbVar6 >> 5;
        lVar10 = lVar10 + 0x20;
      } while (uVar8 < uVar7);
    }
    pAVar3 = local_80;
    internal::StringStreamToString(&local_50,(stringstream *)local_80);
    poVar1 = local_60;
    if (pAVar3 != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))(pAVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/tools/gtest-1.7.0/src/gtest.cc"
               ,0x71e,"Failed");
    _Var4._M_current = local_68;
    pbVar9 = local_70;
    internal::AssertHelper::operator=(&local_88,&local_58);
    internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78.ptr_ + 8))();
    }
  }
  return _Var4._M_current == pbVar9;
}

Assistant:

bool ValidateTestPropertyName(const std::string& property_name,
                              const std::vector<std::string>& reserved_names) {
  if (std::find(reserved_names.begin(), reserved_names.end(), property_name) !=
          reserved_names.end()) {
    ADD_FAILURE() << "Reserved key used in RecordProperty(): " << property_name
                  << " (" << FormatWordList(reserved_names)
                  << " are reserved by " << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}